

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O3

SUNErrCode format_convert(SUNMatrix A,SUNMatrix B)

{
  long *plVar1;
  int iVar2;
  void *pvVar3;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  uint uVar11;
  void *pvVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  undefined8 uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  
  pvVar3 = A->content;
  iVar2 = *(int *)((long)pvVar3 + 0x28);
  pvVar12 = B->content;
  if (iVar2 == *(int *)((long)pvVar12 + 0x28)) {
    lVar5 = *(long *)(*(long *)((long)A->content + 0x38) + *(long *)((long)A->content + 0x18) * 8);
    if (*(long *)((long)B->content + 0x10) < lVar5) {
      pvVar12 = realloc(*(void **)((long)B->content + 0x30),lVar5 * 8);
      pvVar3 = B->content;
      *(void **)((long)pvVar3 + 0x30) = pvVar12;
      pvVar12 = realloc(*(void **)((long)pvVar3 + 0x20),lVar5 * 8);
      pvVar3 = B->content;
      *(void **)((long)pvVar3 + 0x20) = pvVar12;
      *(long *)((long)pvVar3 + 0x10) = lVar5;
    }
    SUNMatZero_Sparse(B);
    pvVar3 = A->content;
    pvVar12 = B->content;
    if (0 < lVar5) {
      lVar18 = *(long *)((long)pvVar3 + 0x20);
      lVar15 = *(long *)((long)pvVar3 + 0x30);
      lVar8 = *(long *)((long)pvVar12 + 0x20);
      lVar19 = *(long *)((long)pvVar12 + 0x30);
      lVar20 = 0;
      do {
        *(undefined8 *)(lVar8 + lVar20 * 8) = *(undefined8 *)(lVar18 + lVar20 * 8);
        *(undefined8 *)(lVar19 + lVar20 * 8) = *(undefined8 *)(lVar15 + lVar20 * 8);
        lVar20 = lVar20 + 1;
      } while (lVar5 != lVar20);
    }
    lVar18 = *(long *)((long)pvVar3 + 0x18);
    if (lVar18 < 1) {
      lVar15 = *(long *)((long)pvVar12 + 0x38);
    }
    else {
      lVar8 = *(long *)((long)pvVar3 + 0x38);
      lVar15 = *(long *)((long)pvVar12 + 0x38);
      lVar19 = 0;
      do {
        *(undefined8 *)(lVar15 + lVar19 * 8) = *(undefined8 *)(lVar8 + lVar19 * 8);
        lVar19 = lVar19 + 1;
        lVar18 = *(long *)((long)pvVar3 + 0x18);
      } while (lVar19 < lVar18);
    }
    *(long *)(lVar15 + lVar18 * 8) = lVar5;
    return 0;
  }
  plVar4 = *(long **)((long)pvVar3 + 0x38);
  lVar5 = *(long *)((long)pvVar3 + 0x20);
  lVar18 = *(long *)((long)pvVar3 + 0x30);
  uVar6 = *(ulong *)((long)pvVar3 + (ulong)(iVar2 != 1) * 8);
  uVar7 = *(ulong *)((long)pvVar3 + (ulong)(iVar2 == 1) * 8);
  lVar15 = *(long *)((long)pvVar12 + 0x38);
  lVar8 = *(long *)((long)pvVar12 + 0x20);
  lVar19 = *(long *)((long)pvVar12 + 0x30);
  uVar14 = plVar4[uVar6];
  uVar11 = SUNMatZero_Sparse(B);
  uVar13 = (ulong)uVar11;
  if (0 < (long)uVar14) {
    uVar13 = 0;
    do {
      plVar1 = (long *)(lVar15 + *(long *)(lVar18 + uVar13 * 8) * 8);
      *plVar1 = *plVar1 + 1;
      uVar13 = uVar13 + 1;
    } while (uVar14 != uVar13);
  }
  if (0 < (long)uVar7) {
    uVar13 = 0;
    lVar20 = 0;
    do {
      lVar16 = *(long *)(lVar15 + uVar13 * 8);
      *(long *)(lVar15 + uVar13 * 8) = lVar20;
      uVar13 = uVar13 + 1;
      lVar20 = lVar16 + lVar20;
    } while (uVar7 != uVar13);
  }
  *(ulong *)(lVar15 + uVar7 * 8) = uVar14;
  if (0 < (long)uVar6) {
    lVar20 = *plVar4;
    uVar14 = 0;
    do {
      uVar13 = uVar14 + 1;
      lVar16 = lVar20;
      lVar20 = plVar4[uVar14 + 1];
      for (; lVar16 < lVar20; lVar16 = lVar16 + 1) {
        lVar20 = *(long *)(lVar18 + lVar16 * 8);
        lVar9 = *(long *)(lVar15 + lVar20 * 8);
        *(ulong *)(lVar19 + lVar9 * 8) = uVar14;
        *(undefined8 *)(lVar8 + lVar9 * 8) = *(undefined8 *)(lVar5 + lVar16 * 8);
        plVar1 = (long *)(lVar15 + lVar20 * 8);
        *plVar1 = *plVar1 + 1;
        lVar20 = plVar4[uVar13];
      }
      uVar14 = uVar13;
    } while (uVar13 != uVar6);
  }
  if (-1 < (long)uVar7) {
    uVar13 = 0;
    uVar17 = 0;
    do {
      uVar10 = *(undefined8 *)(lVar15 + uVar13 * 8);
      *(undefined8 *)(lVar15 + uVar13 * 8) = uVar17;
      uVar13 = uVar13 + 1;
      uVar17 = uVar10;
    } while (uVar7 + 1 != uVar13);
  }
  return (SUNErrCode)uVar13;
}

Assistant:

SUNErrCode format_convert(const SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);

  sunrealtype *Ax, *Bx;
  sunindextype *Ap, *Aj;
  sunindextype *Bp, *Bi;
  sunindextype n_row, n_col, nnz;
  sunindextype n, col, csum, row, last;

  if (SM_SPARSETYPE_S(A) == SM_SPARSETYPE_S(B))
  {
    SUNCheckCall(SUNMatCopy_Sparse(A, B));
    return SUN_SUCCESS;
  }

  Ap = SM_INDEXPTRS_S(A);
  SUNAssert(Ap, SUN_ERR_ARG_CORRUPT);
  Aj = SM_INDEXVALS_S(A);
  SUNAssert(Aj, SUN_ERR_ARG_CORRUPT);
  Ax = SM_DATA_S(A);
  SUNAssert(Ax, SUN_ERR_ARG_CORRUPT);

  n_row = (SM_SPARSETYPE_S(A) == CSR_MAT) ? SM_ROWS_S(A) : SM_COLUMNS_S(A);
  n_col = (SM_SPARSETYPE_S(A) == CSR_MAT) ? SM_COLUMNS_S(A) : SM_ROWS_S(A);

  Bp = SM_INDEXPTRS_S(B);
  Bi = SM_INDEXVALS_S(B);
  Bx = SM_DATA_S(B);

  nnz = Ap[n_row];

  SUNCheckCall(SUNMatZero_Sparse(B));

  /* compute number of non-zero entries per column (if CSR) or per row (if CSC)
   * of A */
  for (n = 0; n < nnz; n++) { Bp[Aj[n]]++; }

  /* cumualtive sum the nnz per column to get Bp[] */
  for (col = 0, csum = 0; col < n_col; col++)
  {
    sunindextype temp = Bp[col];
    Bp[col]           = csum;
    csum += temp;
  }
  Bp[n_col] = nnz;

  for (row = 0; row < n_row; row++)
  {
    sunindextype jj;
    for (jj = Ap[row]; jj < Ap[row + 1]; jj++)
    {
      col               = Aj[jj];
      sunindextype dest = Bp[col];

      Bi[dest] = row;
      Bx[dest] = Ax[jj];

      Bp[col]++;
    }
  }

  for (col = 0, last = 0; col <= n_col; col++)
  {
    sunindextype temp = Bp[col];
    Bp[col]           = last;
    last              = temp;
  }

  return SUN_SUCCESS;
}